

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_>::dispose
          (ArrayBuilder<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *this)

{
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *firstElement;
  RemoveConst<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *pRVar1;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *pOVar2;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *endCopy;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *posCopy;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *ptrCopy;
  ArrayBuilder<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pOVar2 = this->endPtr;
  if (firstElement != (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0) {
    this->ptr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    this->pos = (RemoveConst<kj::Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>_> *)0x0;
    this->endPtr = (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)0x0;
    ArrayDisposer::dispose<kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 3,
               (long)pOVar2 - (long)firstElement >> 3);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }